

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

bool google::protobuf::compiler::cpp::anon_unknown_0::IsPOD(FieldDescriptor *field)

{
  bool bVar1;
  CppType CVar2;
  FieldDescriptor *field_local;
  
  bVar1 = FieldDescriptor::is_repeated(field);
  if ((bVar1) || (bVar1 = FieldDescriptor::is_extension(field), bVar1)) {
    return false;
  }
  CVar2 = FieldDescriptor::cpp_type(field);
  if (CVar2 - CPPTYPE_INT32 < 8) {
    return true;
  }
  if (CVar2 != CPPTYPE_STRING) {
    return false;
  }
  return false;
}

Assistant:

bool IsPOD(const FieldDescriptor* field) {
  if (field->is_repeated() || field->is_extension()) return false;
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_ENUM:
    case FieldDescriptor::CPPTYPE_INT32:
    case FieldDescriptor::CPPTYPE_INT64:
    case FieldDescriptor::CPPTYPE_UINT32:
    case FieldDescriptor::CPPTYPE_UINT64:
    case FieldDescriptor::CPPTYPE_FLOAT:
    case FieldDescriptor::CPPTYPE_DOUBLE:
    case FieldDescriptor::CPPTYPE_BOOL:
      return true;
    case FieldDescriptor::CPPTYPE_STRING:
      return false;
    default:
      return false;
  }
}